

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::formata(CBString *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  CBStringException *pCVar2;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_248 [16];
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  allocator local_189;
  string local_188;
  undefined1 local_168 [8];
  CBStringException bstr__cppwrapper_exception_3;
  string local_138;
  undefined1 local_118 [8];
  CBStringException bstr__cppwrapper_exception_2;
  string local_e8;
  undefined1 local_c8 [8];
  CBStringException bstr__cppwrapper_exception_1;
  allocator local_89;
  string local_88;
  undefined1 local_68 [8];
  CBStringException bstr__cppwrapper_exception;
  int n;
  int r;
  va_list arglist;
  bstring b;
  char *fmt_local;
  CBString *this_local;
  
  if (in_AL != '\0') {
    local_218 = in_XMM0_Qa;
    local_208 = in_XMM1_Qa;
    local_1f8 = in_XMM2_Qa;
    local_1e8 = in_XMM3_Qa;
    local_1d8 = in_XMM4_Qa;
    local_1c8 = in_XMM5_Qa;
    local_1b8 = in_XMM6_Qa;
    local_1a8 = in_XMM7_Qa;
  }
  local_238 = in_RDX;
  local_230 = in_RCX;
  local_228 = in_R8;
  local_220 = in_R9;
  if ((this->super_tagbstring).mlen < 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_88,"CBString::Write protection error",&local_89);
    CBStringException::CBStringException((CBStringException *)local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_68);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (fmt == (char *)0x0) {
    operator+=(this,"<NULL>");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"CBString::CBString::formata (NULL, ...) is erroneous.",
               (allocator *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    CBStringException::CBStringException((CBStringException *)local_c8,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(bstr__cppwrapper_exception_2.msg.field_2._M_local_buf + 0xf));
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,(CBStringException *)local_c8);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  arglist[0].reg_save_area = bfromcstr(anon_var_dwarf_23d28 + 0x10);
  if ((bstring)arglist[0].reg_save_area != (bstring)0x0) {
    sVar3 = strlen(fmt);
    bstr__cppwrapper_exception.msg.field_2._8_4_ = (undefined4)(sVar3 << 1);
    if ((int)bstr__cppwrapper_exception.msg.field_2._8_4_ < 0x10) {
      bstr__cppwrapper_exception.msg.field_2._8_4_ = 0x10;
    }
    while( true ) {
      iVar1 = balloc((bstring)arglist[0].reg_save_area,
                     bstr__cppwrapper_exception.msg.field_2._8_4_ + 2);
      if (iVar1 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_188,"CBString::CBString::format out of memory.",&local_189);
        CBStringException::CBStringException((CBStringException *)local_168,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator((allocator<char> *)&local_189);
        pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
        CBStringException::CBStringException(pCVar2,(CBStringException *)local_168);
        __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
      }
      arglist[0].overflow_arg_area = local_248;
      arglist[0]._0_8_ = &stack0x00000008;
      r = 0x30;
      n = 0x10;
      bstr__cppwrapper_exception.msg.field_2._12_4_ =
           vsnprintf(*(char **)((long)arglist[0].reg_save_area + 8),
                     (long)(bstr__cppwrapper_exception.msg.field_2._8_4_ + 1),fmt,&n);
      *(undefined1 *)
       (*(long *)((long)arglist[0].reg_save_area + 8) +
       (long)(int)bstr__cppwrapper_exception.msg.field_2._8_4_) = 0;
      sVar3 = strlen(*(char **)((long)arglist[0].reg_save_area + 8));
      *(int *)((long)arglist[0].reg_save_area + 4) = (int)sVar3;
      if (*(int *)((long)arglist[0].reg_save_area + 4) <
          (int)bstr__cppwrapper_exception.msg.field_2._8_4_) break;
      if ((int)bstr__cppwrapper_exception.msg.field_2._8_4_ <
          (int)bstr__cppwrapper_exception.msg.field_2._12_4_) {
        bstr__cppwrapper_exception.msg.field_2._8_4_ = bstr__cppwrapper_exception.msg.field_2._12_4_
        ;
      }
      else {
        bstr__cppwrapper_exception.msg.field_2._8_4_ =
             bstr__cppwrapper_exception.msg.field_2._8_4_ * 2;
      }
    }
    operator+=(this,(tagbstring *)arglist[0].reg_save_area);
    bdestroy((bstring)arglist[0].reg_save_area);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_138,"CBString::CBString::format out of memory.",
             (allocator *)(bstr__cppwrapper_exception_3.msg.field_2._M_local_buf + 0xf));
  CBStringException::CBStringException((CBStringException *)local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator
            ((allocator<char> *)(bstr__cppwrapper_exception_3.msg.field_2._M_local_buf + 0xf));
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,(CBStringException *)local_118);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::formata (const char * fmt, ...) {
	bstring b;
	va_list arglist;
	int r, n;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (fmt == NULL) {
		*this += "<NULL>";
		bstringThrow ("CBString::formata (NULL, ...) is erroneous.");
	} else {

		if ((b = bfromcstr ("")) == NULL) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
			bstringThrow ("CBString::format out of memory.");
#else
			*this += "<NULL>";
#endif
		} else {
			if ((n = (int) (2 * (strlen) (fmt))) < START_VSNBUFF) n = START_VSNBUFF;
			for (;;) {
				if (BSTR_OK != balloc (b, n + 2)) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
					bstringThrow ("CBString::format out of memory.");
#else
					b = bformat ("<NULL>");
					break;
#endif
				}

				va_start (arglist, fmt);
				exvsnprintf (r, (char *) b->data, n + 1, fmt, arglist);
				va_end (arglist);

				b->data[n] = '\0';
				b->slen = (int) (strlen) ((char *) b->data);

				if (b->slen < n) break;
				if (r > n) n = r; else n += n;
			}
			*this += *b;
			bdestroy (b);
		}
	}
}